

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

bool __thiscall
cfd::TransactionContext::VerifyInputSignature
          (TransactionContext *this,ByteData *signature,Pubkey *pubkey,OutPoint *outpoint,
          Script *script,SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  bool bVar1;
  ByteData sighash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  SigHashType local_3c;
  
  core::SigHashType::SigHashType(&local_3c,sighash_type);
  (*(this->super_Transaction).super_AbstractTransaction._vptr_AbstractTransaction[0x14])
            (&local_58,this,outpoint,script,&local_3c,value,version);
  core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,
             (ByteData *)&local_58);
  core::ByteData256::ByteData256
            ((ByteData256 *)&local_70,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
  bVar1 = core::SignatureUtil::VerifyEcSignature((ByteData256 *)&local_70,pubkey,signature);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  return bVar1;
}

Assistant:

bool TransactionContext::VerifyInputSignature(
    const ByteData& signature, const Pubkey& pubkey, const OutPoint& outpoint,
    const Script& script, SigHashType sighash_type, const Amount& value,
    WitnessVersion version) const {
  auto sighash =
      CreateSignatureHash(outpoint, script, sighash_type, value, version);
  return SignatureUtil::VerifyEcSignature(
      ByteData256(sighash.GetBytes()), pubkey, signature);
}